

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

PVIP_category_t PVIP_node_category(PVIP_node_type_t type)

{
  uint uVar1;
  
  uVar1 = type - PVIP_NODE_REGEXP;
  if (uVar1 < 0x26) {
    if ((0x2000200509U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      return PVIP_CATEGORY_STRING;
    }
    if ((ulong)uVar1 == 0x1e) {
      return PVIP_CATEGORY_NUMBER;
    }
  }
  if (type == PVIP_NODE_VARIABLE) {
    return PVIP_CATEGORY_STRING;
  }
  if (type == PVIP_NODE_NUMBER) {
    return PVIP_CATEGORY_NUMBER;
  }
  if (type == PVIP_NODE_IDENT) {
    return PVIP_CATEGORY_STRING;
  }
  if (type == PVIP_NODE_STRING) {
    return PVIP_CATEGORY_STRING;
  }
  if (type != PVIP_NODE_INT) {
    return PVIP_CATEGORY_CHILDREN;
  }
  return PVIP_CATEGORY_INT;
}

Assistant:

PVIP_category_t PVIP_node_category(PVIP_node_type_t type) {
    switch (type) {
    case PVIP_NODE_STRING:
    case PVIP_NODE_VARIABLE:
    case PVIP_NODE_IDENT:
    case PVIP_NODE_REGEXP:
    case PVIP_NODE_PERL5_REGEXP:
    case PVIP_NODE_ATTRIBUTE_VARIABLE:
    case PVIP_NODE_PATH:
    case PVIP_NODE_SLANGS:
    case PVIP_NODE_UNICODE_CHAR:
        return PVIP_CATEGORY_STRING;
    case PVIP_NODE_INT:
        return PVIP_CATEGORY_INT;
    case PVIP_NODE_NUMBER:
    case PVIP_NODE_COMPLEX:
        return PVIP_CATEGORY_NUMBER;
    default:
        return PVIP_CATEGORY_CHILDREN;
    }
}